

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void INT_CMConnection_failed(CMConnection conn)

{
  undefined8 *puVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  long *in_RDI;
  timespec ts_1;
  CMCloseHandlerList next;
  CMCloseHandlerList list;
  timespec ts;
  CMTaskHandle prior_task;
  CMConnection in_stack_ffffffffffffff98;
  CManager_conflict in_stack_ffffffffffffffa0;
  CMConnection in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  CManager in_stack_ffffffffffffffc0;
  long local_38;
  undefined8 in_stack_ffffffffffffffd8;
  CMTraceType trace_type;
  undefined8 *puVar5;
  CManager in_stack_ffffffffffffffe0;
  long local_18;
  long local_10;
  long *local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  local_10 = 0;
  if (*(int *)((long)in_RDI + 0x2c) == 0) {
    *(undefined4 *)((long)in_RDI + 0x2c) = 1;
    local_8 = in_RDI;
    transport_wake_any_pending_write(in_stack_ffffffffffffffb0);
    iVar2 = CManager_locked((CManager)*local_8);
    if (iVar2 == 0) {
      __assert_fail("CManager_locked(conn->cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0x52c,"void INT_CMConnection_failed(CMConnection)");
    }
    iVar2 = CMtrace_val[7];
    if (*(long *)(*local_8 + 0x120) == 0) {
      iVar2 = CMtrace_init(in_stack_ffffffffffffffe0,trace_type);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffffb0 = *(CMConnection *)(*local_8 + 0x120);
        _Var3 = getpid();
        in_stack_ffffffffffffffb8 = (char *)(long)_Var3;
        pVar4 = pthread_self();
        fprintf((FILE *)in_stack_ffffffffffffffb0,"P%lxT%lx - ",in_stack_ffffffffffffffb8,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffffe0);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffe0,local_18);
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"CMConnection failed conn=%p\n",local_8);
    }
    fflush(*(FILE **)(*local_8 + 0x120));
    CMconn_fail_conditions((CMConnection)in_stack_ffffffffffffffa0);
    (**(code **)(local_8[1] + 0x60))(&CMstatic_trans_svcs,local_8[2]);
    get_long_attr(local_8[0x13],CM_BW_MEASURE_TASK,&local_10);
    if (local_10 != 0) {
      INT_CMremove_task((CMTaskHandle)in_stack_ffffffffffffffa0);
      set_long_attr(local_8[0x13],CM_BW_MEASURE_TASK,0);
    }
    if (local_8[9] != 0) {
      puVar5 = (undefined8 *)local_8[9];
      local_8[9] = 0;
      while (puVar5 != (undefined8 *)0x0) {
        puVar1 = (undefined8 *)puVar5[2];
        if ((int)local_8[5] == 0) {
          iVar2 = CMtrace_val[2];
          if (*(long *)(*local_8 + 0x120) == 0) {
            iVar2 = CMtrace_init(in_stack_ffffffffffffffe0,(CMTraceType)((ulong)puVar5 >> 0x20));
          }
          if (iVar2 != 0) {
            if (CMtrace_PID != 0) {
              in_stack_ffffffffffffffa0 = *(CManager_conflict *)(*local_8 + 0x120);
              _Var3 = getpid();
              pVar4 = pthread_self();
              fprintf((FILE *)in_stack_ffffffffffffffa0,"P%lxT%lx - ",(long)_Var3,pVar4);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&stack0xffffffffffffffc0);
              fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",in_stack_ffffffffffffffc0,
                      local_38);
            }
            fprintf(*(FILE **)(*local_8 + 0x120),"CM - Calling close handler %p for connection %p\n"
                    ,*puVar5,local_8);
          }
          fflush(*(FILE **)(*local_8 + 0x120));
          IntCManager_unlock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
          (*(code *)*puVar5)(*local_8,local_8,puVar5[1]);
          IntCManager_lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
        }
        INT_CMfree((void *)0x117499);
        puVar5 = puVar1;
      }
    }
    *(undefined4 *)(local_8 + 5) = 1;
    remove_conn_from_CM(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void
INT_CMConnection_failed(CMConnection conn)
{
    CMTaskHandle prior_task = NULL;
    if (conn->failed) return;
    conn->failed = 1;
    transport_wake_any_pending_write(conn);

    assert(CManager_locked(conn->cm));
    CMtrace_out(conn->cm, CMFreeVerbose, "CMConnection failed conn=%p\n", 
		conn);
    CMconn_fail_conditions(conn);
    conn->trans->shutdown_conn(&CMstatic_trans_svcs, conn->transport_data);
    get_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, 
		  (ssize_t*)(intptr_t)&prior_task);
    if (prior_task) {
	INT_CMremove_task(prior_task);
	set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)0);
    }
    if (conn->close_list) {
	CMCloseHandlerList list = conn->close_list;
	conn->close_list = NULL;
	while (list != NULL) {
	    CMCloseHandlerList next = list->next;
	    if (! conn->closed ) {
		CMtrace_out(conn->cm, CMConnectionVerbose, 
			    "CM - Calling close handler %p for connection %p\n",
			    (void*) list->close_handler, (void*)conn);
		CManager_unlock(conn->cm);
		list->close_handler(conn->cm, conn, list->close_client_data);
		CManager_lock(conn->cm);
	    }
	    INT_CMfree(list);
	    list = next;
	}
    }
    conn->closed = 1;
    remove_conn_from_CM(conn->cm, conn);
}